

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint unfilterScanline(uchar *recon,uchar *scanline,uchar *precon,size_t bytewidth,uchar filterType,
                     size_t length)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  ulong uVar14;
  uchar uVar15;
  ulong in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  undefined1 in_R8B;
  ulong in_R9;
  size_t j_4;
  uchar q1_2;
  uchar q0_2;
  uchar p1_5;
  uchar p0_5;
  uchar r1_5;
  uchar r0_5;
  uchar s1_5;
  uchar s0_5;
  uchar q2_1;
  uchar q1_1;
  uchar q0_1;
  uchar p2_3;
  uchar p1_4;
  uchar p0_4;
  uchar r2_3;
  uchar r1_4;
  uchar r0_4;
  uchar s2_3;
  uchar s1_4;
  uchar s0_4;
  uchar q3;
  uchar q2;
  uchar q1;
  uchar q0;
  uchar p3_1;
  uchar p2_2;
  uchar p1_3;
  uchar p0_3;
  uchar r3_1;
  uchar r2_2;
  uchar r1_3;
  uchar r0_3;
  uchar s3_1;
  uchar s2_2;
  uchar s1_3;
  uchar s0_3;
  size_t j_3;
  size_t j_2;
  uchar p1_2;
  uchar r1_2;
  uchar s1_2;
  uchar p0_2;
  uchar r0_2;
  uchar s0_2;
  uchar p2_1;
  uchar r2_1;
  uchar s2_1;
  uchar p1_1;
  uchar r1_1;
  uchar s1_1;
  uchar p0_1;
  uchar r0_1;
  uchar s0_1;
  uchar p3;
  uchar r3;
  uchar s3;
  uchar p2;
  uchar r2;
  uchar s2;
  uchar p1;
  uchar r1;
  uchar s1;
  uchar p0;
  uchar r0;
  uchar s0;
  size_t j_1;
  size_t j;
  size_t i;
  long local_b0;
  long local_80;
  long local_78;
  long local_50;
  long local_48;
  ulong local_40;
  
  switch(in_R8B) {
  case 0:
    for (local_40 = 0; local_40 != in_R9; local_40 = local_40 + 1) {
      *(undefined1 *)(in_RDI + local_40) = *(undefined1 *)(in_RSI + local_40);
    }
    break;
  case 1:
    local_48 = 0;
    for (local_40 = 0; uVar14 = in_RCX, local_40 != in_RCX; local_40 = local_40 + 1) {
      *(undefined1 *)(in_RDI + local_40) = *(undefined1 *)(in_RSI + local_40);
    }
    while (local_40 = uVar14, local_40 != in_R9) {
      *(char *)(in_RDI + local_40) = *(char *)(in_RSI + local_40) + *(char *)(in_RDI + local_48);
      local_48 = local_48 + 1;
      uVar14 = local_40 + 1;
    }
    break;
  case 2:
    if (in_RDX == 0) {
      for (local_40 = 0; local_40 != in_R9; local_40 = local_40 + 1) {
        *(undefined1 *)(in_RDI + local_40) = *(undefined1 *)(in_RSI + local_40);
      }
    }
    else {
      for (local_40 = 0; local_40 != in_R9; local_40 = local_40 + 1) {
        *(char *)(in_RDI + local_40) = *(char *)(in_RSI + local_40) + *(char *)(in_RDX + local_40);
      }
    }
    break;
  case 3:
    if (in_RDX == 0) {
      local_78 = 0;
      for (local_40 = 0; uVar14 = in_RCX, local_40 != in_RCX; local_40 = local_40 + 1) {
        *(undefined1 *)(in_RDI + local_40) = *(undefined1 *)(in_RSI + local_40);
      }
      while (local_40 = uVar14, local_40 != in_R9) {
        *(char *)(in_RDI + local_40) =
             *(char *)(in_RSI + local_40) + (char)((int)(uint)*(byte *)(in_RDI + local_78) >> 1);
        local_78 = local_78 + 1;
        uVar14 = local_40 + 1;
      }
    }
    else {
      local_50 = 0;
      for (local_40 = 0; local_40 != in_RCX; local_40 = local_40 + 1) {
        *(char *)(in_RDI + local_40) =
             *(char *)(in_RSI + local_40) + (char)((int)(uint)*(byte *)(in_RDX + local_40) >> 1);
      }
      if (in_RCX < 4) {
        if (in_RCX < 3) {
          if (1 < in_RCX) {
            for (; local_40 + 1 < in_R9; local_40 = local_40 + 2) {
              cVar1 = *(char *)(in_RSI + 1 + local_40);
              bVar5 = *(byte *)(in_RDI + 1 + local_50);
              bVar6 = *(byte *)(in_RDX + 1 + local_40);
              *(char *)(in_RDI + local_40) =
                   *(char *)(in_RSI + local_40) +
                   (char)((int)((uint)*(byte *)(in_RDI + local_50) +
                               (uint)*(byte *)(in_RDX + local_40)) >> 1);
              *(char *)(in_RDI + 1 + local_40) =
                   cVar1 + (char)((int)((uint)bVar5 + (uint)bVar6) >> 1);
              local_50 = local_50 + 2;
            }
          }
        }
        else {
          for (; local_40 + 2 < in_R9; local_40 = local_40 + 3) {
            cVar1 = *(char *)(in_RSI + 1 + local_40);
            bVar5 = *(byte *)(in_RDI + 1 + local_50);
            bVar6 = *(byte *)(in_RDX + 1 + local_40);
            cVar2 = *(char *)(in_RSI + 2 + local_40);
            bVar7 = *(byte *)(in_RDI + 2 + local_50);
            bVar8 = *(byte *)(in_RDX + 2 + local_40);
            *(char *)(in_RDI + local_40) =
                 *(char *)(in_RSI + local_40) +
                 (char)((int)((uint)*(byte *)(in_RDI + local_50) +
                             (uint)*(byte *)(in_RDX + local_40)) >> 1);
            *(char *)(in_RDI + 1 + local_40) = cVar1 + (char)((int)((uint)bVar5 + (uint)bVar6) >> 1)
            ;
            *(char *)(in_RDI + 2 + local_40) = cVar2 + (char)((int)((uint)bVar7 + (uint)bVar8) >> 1)
            ;
            local_50 = local_50 + 3;
          }
        }
      }
      else {
        for (; local_40 + 3 < in_R9; local_40 = local_40 + 4) {
          cVar1 = *(char *)(in_RSI + 1 + local_40);
          bVar5 = *(byte *)(in_RDI + 1 + local_50);
          bVar6 = *(byte *)(in_RDX + 1 + local_40);
          cVar2 = *(char *)(in_RSI + 2 + local_40);
          bVar7 = *(byte *)(in_RDI + 2 + local_50);
          bVar8 = *(byte *)(in_RDX + 2 + local_40);
          cVar3 = *(char *)(in_RSI + 3 + local_40);
          bVar9 = *(byte *)(in_RDI + 3 + local_50);
          bVar10 = *(byte *)(in_RDX + 3 + local_40);
          *(char *)(in_RDI + local_40) =
               *(char *)(in_RSI + local_40) +
               (char)((int)((uint)*(byte *)(in_RDI + local_50) + (uint)*(byte *)(in_RDX + local_40))
                     >> 1);
          *(char *)(in_RDI + 1 + local_40) = cVar1 + (char)((int)((uint)bVar5 + (uint)bVar6) >> 1);
          *(char *)(in_RDI + 2 + local_40) = cVar2 + (char)((int)((uint)bVar7 + (uint)bVar8) >> 1);
          *(char *)(in_RDI + 3 + local_40) = cVar3 + (char)((int)((uint)bVar9 + (uint)bVar10) >> 1);
          local_50 = local_50 + 4;
        }
      }
      for (; local_40 != in_R9; local_40 = local_40 + 1) {
        *(char *)(in_RDI + local_40) =
             *(char *)(in_RSI + local_40) +
             (char)((int)((uint)*(byte *)(in_RDI + local_50) + (uint)*(byte *)(in_RDX + local_40))
                   >> 1);
        local_50 = local_50 + 1;
      }
    }
    break;
  case 4:
    if (in_RDX == 0) {
      local_b0 = 0;
      for (local_40 = 0; uVar14 = in_RCX, local_40 != in_RCX; local_40 = local_40 + 1) {
        *(undefined1 *)(in_RDI + local_40) = *(undefined1 *)(in_RSI + local_40);
      }
      while (local_40 = uVar14, local_40 != in_R9) {
        *(char *)(in_RDI + local_40) = *(char *)(in_RSI + local_40) + *(char *)(in_RDI + local_b0);
        local_b0 = local_b0 + 1;
        uVar14 = local_40 + 1;
      }
    }
    else {
      local_80 = 0;
      for (local_40 = 0; local_40 != in_RCX; local_40 = local_40 + 1) {
        *(char *)(in_RDI + local_40) = *(char *)(in_RSI + local_40) + *(char *)(in_RDX + local_40);
      }
      if (in_RCX < 4) {
        if (in_RCX < 3) {
          if (1 < in_RCX) {
            for (; local_40 + 1 < in_R9; local_40 = local_40 + 2) {
              cVar1 = *(char *)(in_RSI + local_40);
              cVar2 = *(char *)(in_RSI + 1 + local_40);
              bVar5 = *(byte *)(in_RDI + 1 + local_80);
              bVar6 = *(byte *)(in_RDX + 1 + local_40);
              bVar7 = *(byte *)(in_RDX + 1 + local_80);
              uVar15 = paethPredictor((ushort)*(byte *)(in_RDI + local_80),
                                      (ushort)*(byte *)(in_RDX + local_40),
                                      (ushort)*(byte *)(in_RDX + local_80));
              *(uchar *)(in_RDI + local_40) = cVar1 + uVar15;
              uVar15 = paethPredictor((ushort)bVar5,(ushort)bVar6,(ushort)bVar7);
              *(uchar *)(in_RDI + 1 + local_40) = cVar2 + uVar15;
              local_80 = local_80 + 2;
            }
          }
        }
        else {
          for (; local_40 + 2 < in_R9; local_40 = local_40 + 3) {
            cVar1 = *(char *)(in_RSI + local_40);
            cVar2 = *(char *)(in_RSI + 1 + local_40);
            cVar3 = *(char *)(in_RSI + 2 + local_40);
            bVar5 = *(byte *)(in_RDI + 1 + local_80);
            bVar6 = *(byte *)(in_RDI + 2 + local_80);
            bVar7 = *(byte *)(in_RDX + 1 + local_40);
            bVar8 = *(byte *)(in_RDX + 2 + local_40);
            bVar9 = *(byte *)(in_RDX + 1 + local_80);
            bVar10 = *(byte *)(in_RDX + 2 + local_80);
            uVar15 = paethPredictor((ushort)*(byte *)(in_RDI + local_80),
                                    (ushort)*(byte *)(in_RDX + local_40),
                                    (ushort)*(byte *)(in_RDX + local_80));
            *(uchar *)(in_RDI + local_40) = cVar1 + uVar15;
            uVar15 = paethPredictor((ushort)bVar5,(ushort)bVar7,(ushort)bVar9);
            *(uchar *)(in_RDI + 1 + local_40) = cVar2 + uVar15;
            uVar15 = paethPredictor((ushort)bVar6,(ushort)bVar8,(ushort)bVar10);
            *(uchar *)(in_RDI + 2 + local_40) = cVar3 + uVar15;
            local_80 = local_80 + 3;
          }
        }
      }
      else {
        for (; local_40 + 3 < in_R9; local_40 = local_40 + 4) {
          cVar1 = *(char *)(in_RSI + local_40);
          cVar2 = *(char *)(in_RSI + 1 + local_40);
          cVar3 = *(char *)(in_RSI + 2 + local_40);
          cVar4 = *(char *)(in_RSI + 3 + local_40);
          bVar5 = *(byte *)(in_RDI + 1 + local_80);
          bVar6 = *(byte *)(in_RDI + 2 + local_80);
          bVar7 = *(byte *)(in_RDI + 3 + local_80);
          bVar8 = *(byte *)(in_RDX + 1 + local_40);
          bVar9 = *(byte *)(in_RDX + 2 + local_40);
          bVar10 = *(byte *)(in_RDX + 3 + local_40);
          bVar11 = *(byte *)(in_RDX + 1 + local_80);
          bVar12 = *(byte *)(in_RDX + 2 + local_80);
          bVar13 = *(byte *)(in_RDX + 3 + local_80);
          uVar15 = paethPredictor((ushort)*(byte *)(in_RDI + local_80),
                                  (ushort)*(byte *)(in_RDX + local_40),
                                  (ushort)*(byte *)(in_RDX + local_80));
          *(uchar *)(in_RDI + local_40) = cVar1 + uVar15;
          uVar15 = paethPredictor((ushort)bVar5,(ushort)bVar8,(ushort)bVar11);
          *(uchar *)(in_RDI + 1 + local_40) = cVar2 + uVar15;
          uVar15 = paethPredictor((ushort)bVar6,(ushort)bVar9,(ushort)bVar12);
          *(uchar *)(in_RDI + 2 + local_40) = cVar3 + uVar15;
          uVar15 = paethPredictor((ushort)bVar7,(ushort)bVar10,(ushort)bVar13);
          *(uchar *)(in_RDI + 3 + local_40) = cVar4 + uVar15;
          local_80 = local_80 + 4;
        }
      }
      for (; local_40 != in_R9; local_40 = local_40 + 1) {
        cVar1 = *(char *)(in_RSI + local_40);
        uVar15 = paethPredictor((ushort)*(byte *)(in_RDI + (local_40 - in_RCX)),
                                (ushort)*(byte *)(in_RDX + local_40),
                                (ushort)*(byte *)(in_RDX + local_80));
        *(uchar *)(in_RDI + local_40) = cVar1 + uVar15;
        local_80 = local_80 + 1;
      }
    }
    break;
  default:
    return 0x24;
  }
  return 0;
}

Assistant:

static unsigned unfilterScanline(unsigned char* recon, const unsigned char* scanline, const unsigned char* precon,
                                 size_t bytewidth, unsigned char filterType, size_t length) {
  /*
  For PNG filter method 0
  unfilter a PNG image scanline by scanline. when the pixels are smaller than 1 byte,
  the filter works byte per byte (bytewidth = 1)
  precon is the previous unfiltered scanline, recon the result, scanline the current one
  the incoming scanlines do NOT include the filtertype byte, that one is given in the parameter filterType instead
  recon and scanline MAY be the same memory address! precon must be disjoint.
  */

  size_t i;
  switch(filterType) {
    case 0:
      for(i = 0; i != length; ++i) recon[i] = scanline[i];
      break;
    case 1: {
      size_t j = 0;
      for(i = 0; i != bytewidth; ++i) recon[i] = scanline[i];
      for(i = bytewidth; i != length; ++i, ++j) recon[i] = scanline[i] + recon[j];
      break;
    }
    case 2:
      if(precon) {
        for(i = 0; i != length; ++i) recon[i] = scanline[i] + precon[i];
      } else {
        for(i = 0; i != length; ++i) recon[i] = scanline[i];
      }
      break;
    case 3:
      if(precon) {
        size_t j = 0;
        for(i = 0; i != bytewidth; ++i) recon[i] = scanline[i] + (precon[i] >> 1u);
        /* Unroll independent paths of this predictor. A 6x and 8x version is also possible but that adds
        too much code. Whether this speeds up anything depends on compiler and settings. */
        if(bytewidth >= 4) {
          for(; i + 3 < length; i += 4, j += 4) {
            unsigned char s0 = scanline[i + 0], r0 = recon[j + 0], p0 = precon[i + 0];
            unsigned char s1 = scanline[i + 1], r1 = recon[j + 1], p1 = precon[i + 1];
            unsigned char s2 = scanline[i + 2], r2 = recon[j + 2], p2 = precon[i + 2];
            unsigned char s3 = scanline[i + 3], r3 = recon[j + 3], p3 = precon[i + 3];
            recon[i + 0] = s0 + ((r0 + p0) >> 1u);
            recon[i + 1] = s1 + ((r1 + p1) >> 1u);
            recon[i + 2] = s2 + ((r2 + p2) >> 1u);
            recon[i + 3] = s3 + ((r3 + p3) >> 1u);
          }
        } else if(bytewidth >= 3) {
          for(; i + 2 < length; i += 3, j += 3) {
            unsigned char s0 = scanline[i + 0], r0 = recon[j + 0], p0 = precon[i + 0];
            unsigned char s1 = scanline[i + 1], r1 = recon[j + 1], p1 = precon[i + 1];
            unsigned char s2 = scanline[i + 2], r2 = recon[j + 2], p2 = precon[i + 2];
            recon[i + 0] = s0 + ((r0 + p0) >> 1u);
            recon[i + 1] = s1 + ((r1 + p1) >> 1u);
            recon[i + 2] = s2 + ((r2 + p2) >> 1u);
          }
        } else if(bytewidth >= 2) {
          for(; i + 1 < length; i += 2, j += 2) {
            unsigned char s0 = scanline[i + 0], r0 = recon[j + 0], p0 = precon[i + 0];
            unsigned char s1 = scanline[i + 1], r1 = recon[j + 1], p1 = precon[i + 1];
            recon[i + 0] = s0 + ((r0 + p0) >> 1u);
            recon[i + 1] = s1 + ((r1 + p1) >> 1u);
          }
        }
        for(; i != length; ++i, ++j) recon[i] = scanline[i] + ((recon[j] + precon[i]) >> 1u);
      } else {
        size_t j = 0;
        for(i = 0; i != bytewidth; ++i) recon[i] = scanline[i];
        for(i = bytewidth; i != length; ++i, ++j) recon[i] = scanline[i] + (recon[j] >> 1u);
      }
      break;
    case 4:
      if(precon) {
        size_t j = 0;
        for(i = 0; i != bytewidth; ++i) {
          recon[i] = (scanline[i] + precon[i]); /*paethPredictor(0, precon[i], 0) is always precon[i]*/
        }

        /* Unroll independent paths of the paeth predictor. A 6x and 8x version is also possible but that
        adds too much code. Whether this speeds up anything depends on compiler and settings. */
        if(bytewidth >= 4) {
          for(; i + 3 < length; i += 4, j += 4) {
            unsigned char s0 = scanline[i + 0], s1 = scanline[i + 1], s2 = scanline[i + 2], s3 = scanline[i + 3];
            unsigned char r0 = recon[j + 0], r1 = recon[j + 1], r2 = recon[j + 2], r3 = recon[j + 3];
            unsigned char p0 = precon[i + 0], p1 = precon[i + 1], p2 = precon[i + 2], p3 = precon[i + 3];
            unsigned char q0 = precon[j + 0], q1 = precon[j + 1], q2 = precon[j + 2], q3 = precon[j + 3];
            recon[i + 0] = s0 + paethPredictor(r0, p0, q0);
            recon[i + 1] = s1 + paethPredictor(r1, p1, q1);
            recon[i + 2] = s2 + paethPredictor(r2, p2, q2);
            recon[i + 3] = s3 + paethPredictor(r3, p3, q3);
          }
        } else if(bytewidth >= 3) {
          for(; i + 2 < length; i += 3, j += 3) {
            unsigned char s0 = scanline[i + 0], s1 = scanline[i + 1], s2 = scanline[i + 2];
            unsigned char r0 = recon[j + 0], r1 = recon[j + 1], r2 = recon[j + 2];
            unsigned char p0 = precon[i + 0], p1 = precon[i + 1], p2 = precon[i + 2];
            unsigned char q0 = precon[j + 0], q1 = precon[j + 1], q2 = precon[j + 2];
            recon[i + 0] = s0 + paethPredictor(r0, p0, q0);
            recon[i + 1] = s1 + paethPredictor(r1, p1, q1);
            recon[i + 2] = s2 + paethPredictor(r2, p2, q2);
          }
        } else if(bytewidth >= 2) {
          for(; i + 1 < length; i += 2, j += 2) {
            unsigned char s0 = scanline[i + 0], s1 = scanline[i + 1];
            unsigned char r0 = recon[j + 0], r1 = recon[j + 1];
            unsigned char p0 = precon[i + 0], p1 = precon[i + 1];
            unsigned char q0 = precon[j + 0], q1 = precon[j + 1];
            recon[i + 0] = s0 + paethPredictor(r0, p0, q0);
            recon[i + 1] = s1 + paethPredictor(r1, p1, q1);
          }
        }

        for(; i != length; ++i, ++j) {
          recon[i] = (scanline[i] + paethPredictor(recon[i - bytewidth], precon[i], precon[j]));
        }
      } else {
        size_t j = 0;
        for(i = 0; i != bytewidth; ++i) {
          recon[i] = scanline[i];
        }
        for(i = bytewidth; i != length; ++i, ++j) {
          /*paethPredictor(recon[i - bytewidth], 0, 0) is always recon[i - bytewidth]*/
          recon[i] = (scanline[i] + recon[j]);
        }
      }
      break;
    default: return 36; /*error: invalid filter type given*/
  }
  return 0;
}